

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void done(int how)

{
  short sVar1;
  int fd_00;
  boolean bVar2;
  char cVar3;
  char *pcVar4;
  long umoney_00;
  bool bVar5;
  char *local_178;
  uint local_16c;
  char *local_168;
  char *local_158;
  int local_144;
  int local_13c;
  int mnum;
  char *dumpname;
  long umoney;
  obj *corpse;
  char local_118 [7];
  boolean bones_ok;
  char pbuf [256];
  int iStack_c;
  boolean taken;
  int fd;
  int how_local;
  
  umoney = 0;
  bVar2 = check_survival(how,killbuf);
  if (bVar2 != '\0') {
    return;
  }
  if (program_state.viewing == 0) {
    program_state.gameover = 1;
    if (how != 0xc) {
      log_command_result();
      iflags.vision_inited = '\0';
      inven_inuse('\x01');
      if ((moves < 2) && (how < 0xc)) {
        pcVar4 = currency(200);
        pline("Do not pass go.  Do not collect 200 %s.",pcVar4);
      }
      bVar5 = false;
      if (how < 10) {
        bVar2 = can_make_bones(&u.uz);
        bVar5 = bVar2 != '\0';
      }
      if (how == 9) {
        u.ugrave_arise = 0xd7;
      }
      if ((bVar5) && (u.ugrave_arise < 0)) {
        if (how == 5) {
          u.ugrave_arise = -3;
        }
        else if (how == 8) {
          u.ugrave_arise = -2;
        }
        else if ((u.ugrave_arise == -1) && ((mvitals[u.umonnum].mvflags & 0x10) == 0)) {
          local_13c = u.umonnum;
          if (u.umonnum == u.umonster) {
            sVar1 = urace.malenum;
            if ((flags.female != '\0') && (urace.femalenum != -1)) {
              sVar1 = urace.femalenum;
            }
            local_144 = (int)sVar1;
            local_13c = local_144;
          }
          umoney = (long)mk_named_object(0x10e,mons + local_13c,(int)u.ux,(int)u.uy,plname);
          if (killer_format == 2) {
            local_158 = "";
          }
          else {
            local_158 = killed_by_prefix[how];
          }
          if (killer_format == 0) {
            local_168 = an(killer);
          }
          else {
            local_168 = killer;
          }
          sprintf(local_118,"%s, %s%s",plname,local_158,local_168);
          make_grave(level,(int)u.ux,(int)u.uy,local_118);
        }
      }
      iStack_c = how;
      if ((how == 0xe) && (killer_format = 2, u.uhp < 1)) {
        iStack_c = 0;
        u.umortality = u.umortality + 1;
        strcpy(killbuf,"quit while already on Charon\'s boat");
      }
      fd_00 = logfile;
      if ((iStack_c == 0xf) || (iStack_c == 0x10)) {
        killer_format = 2;
      }
      log_finish(LS_DONE);
      write_log_toptenentry(fd_00,iStack_c);
      program_state.something_worth_saving = 0;
      if (iStack_c == 0xf) {
        local_16c = 0xffffffff;
      }
      else {
        local_16c = (uint)(iStack_c != 0xe);
      }
      pbuf[0xff] = paybill(local_16c);
      paygd();
      clearpriests();
      (*windowprocs.win_pause)(P_MESSAGE);
      if (iStack_c < 0xc) {
        check_tutorial_message(0x167);
      }
      if (flags.end_disclose != '-') {
        disclose(iStack_c,pbuf[0xff]);
      }
      local_178 = begin_dump(iStack_c);
      dump_disclose(iStack_c);
      if ((bVar5) && (pbuf[0xff] != '\0')) {
        finish_paybill();
      }
      umoney_00 = calc_score(iStack_c);
      if ((bVar5) &&
         ((flags.debug == '\0' ||
          ((program_state.stopprint == 0 &&
           (cVar3 = yn_function("Save bones?","yn",'n'), cVar3 == 'y')))))) {
        savebones((obj *)umoney);
      }
      done_money = (int)umoney_00;
      end_dump(iStack_c,killbuf,local_118,umoney_00);
      display_rip(iStack_c,killbuf,local_118,umoney_00);
      if (local_178 == (char *)0x0) {
        local_178 = "";
      }
      update_topten(iStack_c,local_178);
      terminate();
    }
    terminate();
  }
  terminate();
}

Assistant:

void done(int how)
{
	int fd;
	boolean taken;
	char pbuf[BUFSZ];
	boolean bones_ok;
	struct obj *corpse = NULL;
	long umoney;
	const char *dumpname;

	if (check_survival(how, killbuf))
	    return;
	
	/* replays are done here: no dumping or high-score calculation required */
	if (program_state.viewing)
	    terminate();
	
	/*
	 *	The game is now over...
	 */
	program_state.gameover = 1;
	
	/* don't do the whole post-game dance if the game exploded */
	if (how == PANICKED)
	    terminate();
	
	log_command_result();
	/* render vision subsystem inoperative */
	iflags.vision_inited = 0;
	/* might have been killed while using a disposable item, so make sure
	   it's gone prior to inventory disclosure and creation of bones data */
	inven_inuse(TRUE);

	/* Sometimes you die on the first move.  Life's not fair.
	 * On those rare occasions you get hosed immediately, go out
	 * smiling... :-)  -3.
	 */
	if (moves <= 1 && how < PANICKED)	/* You die... --More-- */
	    pline("Do not pass go.  Do not collect 200 %s.", currency(200L));

	bones_ok = (how < GENOCIDED) && can_make_bones(&u.uz);

	if (how == TURNED_SLIME)
	    u.ugrave_arise = PM_GREEN_SLIME;

	if (bones_ok && u.ugrave_arise < LOW_PM) {
	    /* corpse gets burnt up too */
	    if (how == BURNING)
		u.ugrave_arise = (NON_PM - 2);	/* leave no corpse */
	    else if (how == STONING)
		u.ugrave_arise = (NON_PM - 1);	/* statue instead of corpse */
	    else if (u.ugrave_arise == NON_PM &&
		     !(mvitals[u.umonnum].mvflags & G_NOCORPSE)) {
		int mnum = u.umonnum;

		if (!Upolyd) {
		    /* Base corpse on race when not poly'd since original
		     * u.umonnum is based on role, and all role monsters
		     * are human.
		     */
		    mnum = (flags.female && urace.femalenum != NON_PM) ?
			urace.femalenum : urace.malenum;
		}
		corpse = mk_named_object(CORPSE, &mons[mnum],
				       u.ux, u.uy, plname);
		sprintf(pbuf, "%s, %s%s", plname,
			killer_format == NO_KILLER_PREFIX ? "" :
			killed_by_prefix[how],
			killer_format == KILLED_BY_AN ? an(killer) : killer);
		make_grave(level, u.ux, u.uy, pbuf);
	    }
	}

	if (how == QUIT) {
		killer_format = NO_KILLER_PREFIX;
		if (u.uhp < 1) {
			how = DIED;
			u.umortality++;	/* skipped above when how==QUIT */
			/* note that killer is pointing at killbuf */
			strcpy(killbuf, "quit while already on Charon's boat");
		}
	}
	if (how == ESCAPED || how == DEFIED)
		killer_format = NO_KILLER_PREFIX;
	
	fd = logfile;
	log_finish(LS_DONE);
	/* write_log_toptenentry needs killer_format */
	write_log_toptenentry(fd, how);
	/* in case of a subsequent panic(), there's no point trying to save */
	program_state.something_worth_saving = 0;

	/* these affect score and/or bones, but avoid them during panic */
	taken = paybill((how == ESCAPED) ? -1 : (how != QUIT));
	paygd();
	clearpriests();

	win_pause_output(P_MESSAGE);

	if (how < PANICKED)
	    check_tutorial_message(QT_T_DEATH);

	if (flags.end_disclose != DISCLOSE_NO_WITHOUT_PROMPT)
	    disclose(how, taken);

	dumpname = begin_dump(how);
	dump_disclose(how);
	
	/* finish_paybill should be called after disclosure but before bones */
	if (bones_ok && taken) finish_paybill();

	/* calculate score, before creating bones [container gold] */
	umoney = calc_score(how);

	if (bones_ok) {
	    if (!wizard || (!done_stopprint && yn("Save bones?") == 'y'))
		savebones(corpse);
	    /* corpse may be invalid pointer now so
		ensure that it isn't used again */
	    corpse = NULL;
	}

	/* update gold for the rip output, which can't use hidden_gold()
	   (containers will be gone by then if bones just got saved...) */
	done_money = umoney;

	end_dump(how, killbuf, pbuf, umoney);
	display_rip(how, killbuf, pbuf, umoney);

	/* generate a topten entry for this game.
	   update_topten does not display anything. */
	update_topten(how, dumpname ? dumpname : "");

	terminate();
}